

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QString * __thiscall QLocale::pmText(QLocale *this)

{
  bool bVar1;
  QLocalePrivate *pQVar2;
  QSystemLocale *this_00;
  DataRange *in_RDI;
  long in_FS_OFFSET;
  QString *res;
  QVariant *in_stack_ffffffffffffff58;
  DataRange *this_01;
  undefined1 local_48 [32];
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  pQVar2 = QSharedDataPointer<QLocalePrivate>::operator->
                     ((QSharedDataPointer<QLocalePrivate> *)0x4d3cb2);
  if (pQVar2->m_data == &systemLocaleData) {
    in_RDI[2] = (DataRange)&DAT_aaaaaaaaaaaaaaaa;
    *in_RDI = (DataRange)&DAT_aaaaaaaaaaaaaaaa;
    in_RDI[1] = (DataRange)&DAT_aaaaaaaaaaaaaaaa;
    this_00 = systemLocale();
    ::QVariant::QVariant((QVariant *)0x4d3cfd);
    (*this_00->_vptr_QSystemLocale[2])(local_28,this_00,0x1c,local_48);
    ::QVariant::toString(in_stack_ffffffffffffff58);
    ::QVariant::~QVariant((QVariant *)this_00);
    ::QVariant::~QVariant((QVariant *)this_00);
    bVar1 = QString::isEmpty((QString *)0x4d3d54);
    if (!bVar1) goto LAB_004d3dfa;
    QString::~QString((QString *)0x4d3dbf);
  }
  pQVar2 = QSharedDataPointer<QLocalePrivate>::operator->
                     ((QSharedDataPointer<QLocalePrivate> *)0x4d3dd7);
  QLocaleData::postMeridiem(pQVar2->m_data);
  QLocaleData::DataRange::getData(this_01,(char16_t *)in_RDI);
LAB_004d3dfa:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)this_01;
  }
  __stack_chk_fail();
}

Assistant:

QString QLocale::pmText() const
{
#ifndef QT_NO_SYSTEMLOCALE
    if (d->m_data == &systemLocaleData) {
        auto res = systemLocale()->query(QSystemLocale::PMText).toString();
        if (!res.isEmpty())
            return res;
    }
#endif
    return d->m_data->postMeridiem().getData(pm_data);
}